

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[23],char_const*,char[57],char_const*,char[52]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [23],char **RestArgs,char (*RestArgs_1) [57],char **RestArgs_2,
               char (*RestArgs_3) [52])

{
  char (*RestArgs_local_3) [52];
  char **RestArgs_local_2;
  char (*RestArgs_local_1) [57];
  char **RestArgs_local;
  char (*FirstArg_local) [23];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[23]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[57],char_const*,char[52]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}